

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-1123_type.h
# Opt level: O2

bool date::rfc1123::read<std::istreambuf_iterator<char,std::char_traits<char>>>
               (istreambuf_iterator<char,_std::char_traits<char>_> *pos,
               istreambuf_iterator<char,_std::char_traits<char>_> *end,parts *value)

{
  parts *ppVar1;
  undefined8 uVar2;
  bool bVar3;
  week_day wVar4;
  year_type yVar5;
  istreambuf_iterator<char,_std::char_traits<char>_> *piVar6;
  parts local_448;
  offset_type offset_minutes;
  offset_type offset_hours;
  character_t<char> local_435;
  character_t<char> local_434;
  character_t<char> local_433;
  character_t<char> local_432;
  character_t<char> local_431;
  parts *local_430;
  unsigned_integer_t<unsigned_char,_2U,_2U> local_428;
  unsigned_integer_t<unsigned_short,_2U,_4U> local_420;
  unsigned_integer_t<unsigned_char,_2U,_2U> local_418;
  unsigned_integer_t<unsigned_char,_1U,_2U> local_410;
  optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_> local_408;
  aliases_t<char,_4UL,_unsigned_char,_12UL> local_3f8;
  optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>
  local_3e8;
  cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
  local_3c8;
  tuple<date::optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
  fmt;
  array<std::pair<date::static_string<char,_4UL>,_unsigned_char>,_7UL> weekday_aliases;
  array<std::pair<date::static_string<char,_4UL>,_short>,_11UL> zone_aliases;
  array<std::pair<date::static_string<char,_4UL>,_unsigned_char>,_12UL> month_aliases;
  
  memcpy(&weekday_aliases,&DAT_0010c248,0xa8);
  memcpy(&month_aliases,&DAT_0010c2f0,0x120);
  memcpy(&zone_aliases,&DAT_0010c410,0x108);
  piVar6 = skip_spaces<std::istreambuf_iterator<char,std::char_traits<char>>>(pos,end);
  pos->_M_sbuf = piVar6->_M_sbuf;
  pos->_M_c = piVar6->_M_c;
  bVar3 = std::istreambuf_iterator<char,_std::char_traits<char>_>::equal(pos,end);
  if (!bVar3) {
    local_3f8.value = &local_448.month;
    local_410.value = &local_448.day;
    local_428.value = &local_448.hour;
    local_448.offset_in_minutes = 0;
    local_3e8.formatters.
    super__Tuple_impl<0UL,_date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>
    .super__Head_base<0UL,_date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_false>._M_head_impl.value
         = &local_448.week_day;
    local_448.year = 0;
    local_448.month = '\0';
    local_448.day = '\0';
    local_448.week_day = '\0';
    local_448.hour = '\0';
    local_448.minute = '\0';
    local_448.second = '\0';
    local_3c8.branches.
    super__Tuple_impl<0UL,_date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
    .
    super__Tuple_impl<1UL,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
    .
    super__Head_base<1UL,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>,_false>
    ._M_head_impl.formatters.
    super__Tuple_impl<0UL,_date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>
    .super__Head_base<0UL,_date::signed_integer_t<short,_2U,_2U,_true>,_false>._M_head_impl.value =
         (signed_integer_t<short,_2U,_2U,_true>)&offset_hours;
    offset_hours = 0;
    local_3c8.branches.
    super__Tuple_impl<0UL,_date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
    .
    super__Tuple_impl<1UL,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
    .
    super__Head_base<1UL,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>,_false>
    ._M_head_impl.formatters.
    super__Tuple_impl<0UL,_date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>
    .super__Tuple_impl<1UL,_date::unsigned_integer_t<short,_2U,_2U>_>.
    super__Head_base<1UL,_date::unsigned_integer_t<short,_2U,_2U>,_false>._M_head_impl.value =
         (_Head_base<1UL,_date::unsigned_integer_t<short,_2U,_2U>,_false>)&offset_minutes;
    offset_minutes = 0;
    local_3c8.branches.
    super__Tuple_impl<0UL,_date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
    .super__Head_base<0UL,_date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_false>.
    _M_head_impl.formatters.super__Tuple_impl<0UL,_date::aliases_t<char,_4UL,_short,_11UL>_>.
    super__Head_base<0UL,_date::aliases_t<char,_4UL,_short,_11UL>,_false>._M_head_impl.value =
         &local_448.offset_in_minutes;
    local_3e8.formatters.
    super__Tuple_impl<0UL,_date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>
    .super__Tuple_impl<1UL,_date::characters_t<char,_3UL>_>.
    super__Head_base<1UL,_date::characters_t<char,_3UL>,_false>._M_head_impl.value.m_data._M_elems
    [0] = ',';
    local_3e8.formatters.
    super__Tuple_impl<0UL,_date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>
    .super__Tuple_impl<1UL,_date::characters_t<char,_3UL>_>.
    super__Head_base<1UL,_date::characters_t<char,_3UL>,_false>._M_head_impl.value.m_data._M_elems
    [1] = ' ';
    local_3e8.formatters.
    super__Tuple_impl<0UL,_date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>
    .super__Tuple_impl<1UL,_date::characters_t<char,_3UL>_>.
    super__Head_base<1UL,_date::characters_t<char,_3UL>,_false>._M_head_impl.value.m_data._M_elems
    [2] = '\0';
    local_3e8.formatters.
    super__Tuple_impl<0UL,_date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>
    .super__Tuple_impl<1UL,_date::characters_t<char,_3UL>_>.
    super__Head_base<1UL,_date::characters_t<char,_3UL>,_false>._M_head_impl.value._3_5_ = 0;
    local_3e8.formatters.
    super__Tuple_impl<0UL,_date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>
    .super__Tuple_impl<1UL,_date::characters_t<char,_3UL>_>.
    super__Head_base<1UL,_date::characters_t<char,_3UL>,_false>._M_head_impl.value.m_length = 2;
    local_418.value = &local_448.minute;
    local_408.formatters.
    super__Tuple_impl<0UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>
    .super__Tuple_impl<1UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>.
    super__Head_base<1UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_false>._M_head_impl.value
         = (_Head_base<1UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_false>)
           &local_448.second;
    local_434.value = ':';
    local_408.formatters.
    super__Tuple_impl<0UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>
    .super__Head_base<0UL,_date::character_t<char>,_false>._M_head_impl.value =
         (character_t<char>)':';
    local_431.value = ' ';
    local_432.value = ' ';
    local_433.value = ' ';
    local_435.value = ' ';
    local_430 = value;
    local_420.value = &local_448.year;
    local_3f8.aliases = &month_aliases;
    local_3e8.formatters.
    super__Tuple_impl<0UL,_date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>
    .super__Head_base<0UL,_date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_false>._M_head_impl.
    aliases = &weekday_aliases;
    local_3c8.branches.
    super__Tuple_impl<0UL,_date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
    .super__Head_base<0UL,_date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_false>.
    _M_head_impl.formatters.super__Tuple_impl<0UL,_date::aliases_t<char,_4UL,_short,_11UL>_>.
    super__Head_base<0UL,_date::aliases_t<char,_4UL,_short,_11UL>,_false>._M_head_impl.aliases =
         &zone_aliases;
    std::
    tuple<date::optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    ::
    tuple<date::optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>,_true,_true>
              (&fmt,&local_3e8,&local_410,&local_431,&local_3f8,&local_432,&local_420,&local_433,
               &local_428,&local_434,&local_418,&local_408,&local_435,&local_3c8);
    bVar3 = read<std::istreambuf_iterator<char,std::char_traits<char>>,date::optional_t<date::aliases_t<char,4ul,unsigned_char,7ul>,date::characters_t<char,3ul>>,date::unsigned_integer_t<unsigned_char,1u,2u>,date::character_t<char>,date::aliases_t<char,4ul,unsigned_char,12ul>,date::character_t<char>,date::unsigned_integer_t<unsigned_short,2u,4u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::optional_t<date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>>,date::character_t<char>,date::cases_t<date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>>
                      (pos,end,&fmt);
    if ((bVar3) && (bVar3 = validate(&local_448), ppVar1 = local_430, bVar3)) {
      yVar5 = local_448.year;
      if (local_448.year < 100) {
        yVar5 = local_448.year + 0x76c;
        local_448.year = yVar5;
      }
      uVar2 = local_448._0_8_;
      if (local_448.offset_in_minutes == 0) {
        local_448.offset_in_minutes = -offset_minutes;
        if (0 < offset_hours) {
          local_448.offset_in_minutes = offset_minutes;
        }
        local_448.offset_in_minutes = local_448.offset_in_minutes + offset_hours * 0x3c;
      }
      if (local_448.week_day == '\0') {
        local_3e8.formatters.
        super__Tuple_impl<0UL,_date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>
        .super__Tuple_impl<1UL,_date::characters_t<char,_3UL>_>.
        super__Head_base<1UL,_date::characters_t<char,_3UL>,_false>._M_head_impl.value.m_data.
        _M_elems[2] = local_448.month;
        local_3e8.formatters.
        super__Tuple_impl<0UL,_date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>
        .super__Tuple_impl<1UL,_date::characters_t<char,_3UL>_>.
        super__Head_base<1UL,_date::characters_t<char,_3UL>,_false>._M_head_impl.value._3_1_ =
             local_448.day;
        local_3e8.formatters.
        super__Tuple_impl<0UL,_date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>
        .super__Tuple_impl<1UL,_date::characters_t<char,_3UL>_>.
        super__Head_base<1UL,_date::characters_t<char,_3UL>,_false>._M_head_impl.value.m_data.
        _M_elems[0] = (char)yVar5;
        local_3e8.formatters.
        super__Tuple_impl<0UL,_date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>
        .super__Tuple_impl<1UL,_date::characters_t<char,_3UL>_>.
        super__Head_base<1UL,_date::characters_t<char,_3UL>,_false>._M_head_impl.value.m_data.
        _M_elems[1] = (char)(yVar5 >> 8);
        local_448._0_8_ = uVar2;
        wVar4 = calendar_helper::day_of_week((date *)&local_3e8);
        local_448.week_day = wVar4;
      }
      ppVar1->offset_in_minutes = local_448.offset_in_minutes;
      ppVar1->year = local_448.year;
      ppVar1->month = local_448.month;
      ppVar1->day = local_448.day;
      ppVar1->week_day = local_448.week_day;
      ppVar1->hour = local_448.hour;
      ppVar1->minute = local_448.minute;
      ppVar1->second = local_448.second;
      return true;
    }
  }
  return false;
}

Assistant:

static bool read(Iterator& pos, const Iterator& end, parts& value)
    {
        using char_type = typename iterator_traits<Iterator>::value_type;
        constexpr auto weekday_aliases = weekday_names<char_type>();
        constexpr auto month_aliases = month_names<char_type>();
        constexpr auto zone_aliases = zone_names<char_type>();

        pos = skip_spaces(pos, end);
        if (pos == end)
            return false;

        parts dt{};
        std::memset(static_cast<void*>(&dt), 0, sizeof(parts));

        offset_type offset_hours = 0;
        offset_type offset_minutes = 0;
        auto fmt = format(
            optional(
                aliases(dt.week_day, weekday_aliases), 
                characters<char_type>(", ")),
            unsigned_integer<1, 2>(dt.day),    character<char_type>(' '), 
            aliases(dt.month, month_aliases),  character<char_type>(' '), 
            unsigned_integer<2, 4>(dt.year),   character<char_type>(' '),
            unsigned_integer<2, 2>(dt.hour),   character<char_type>(':'), 
            unsigned_integer<2, 2>(dt.minute), 
            optional(
                character<char_type>(':'),
                unsigned_integer<2, 2>(dt.second)), 
            character<char_type>(' '), 
            cases(
                branch(
                    aliases(dt.offset_in_minutes, zone_aliases)),
                branch(
                    signed_integer<2, 2, SignRequired>(offset_hours),
                    unsigned_integer<2, 2>(offset_minutes))));

        if (!::date::read(pos, end, fmt) || !validate(dt))
            return false;

        if (dt.year < 100)
            dt.year += 1900;

        if (dt.offset_in_minutes == 0)
            dt.offset_in_minutes = offset_hours * 60 + (offset_hours > 0 ? offset_minutes : -offset_minutes);

        if (dt.week_day == 0)
            dt.week_day = calendar_helper::day_of_week(calendar_helper::date{ dt.year, dt.month, dt.day });

        value = dt;
        return true;
    }